

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_timestamp
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  byte bVar3;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar4;
  State SVar5;
  element_type *peVar6;
  element_type *peVar7;
  char *__nptr;
  Atom *pAVar8;
  shared_ptr<r_comp::RepliStruct> local_1c0;
  allocator local_1a9;
  string local_1a8 [36];
  State local_184;
  shared_ptr<r_comp::RepliStruct> local_180;
  State local_16c;
  State s;
  invalid_argument *ia;
  Atom local_158 [4];
  Atom local_154 [4];
  Atom local_150 [4];
  Atom local_14c [4];
  undefined8 local_148;
  uint64_t ts;
  char *p_1;
  string number;
  allocator local_111;
  string local_110 [32];
  shared_ptr<r_comp::RepliStruct> local_f0;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar4 = read_nil_us(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar4) {
    this_local._7_1_ = 1;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    write_index_00 = extent_index_local._6_2_;
    extent_index_00 = puStack_40;
    bVar3 = local_41;
    Class::Class(&local_c0,TIMESTAMP);
    bVar4 = read_variable(this,local_78,write_index_00,extent_index_00,(bool)(bVar3 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar4) {
      this_local._7_1_ = 1;
    }
    else {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
      bVar4 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1)
                             ,TIMESTAMP);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
      if (bVar4) {
        this_local._7_1_ = 1;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar4 = read_wildcard(this,&local_e0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (bVar4) {
          this_local._7_1_ = 1;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_f0,node);
          bVar4 = read_tail_wildcard(this,&local_f0,extent_index_local._6_2_,puStack_40,
                                     (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f0);
          if (bVar4) {
            this_local._7_1_ = 1;
          }
          else {
            peVar6 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)node);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_110,"us",&local_111);
            bVar4 = r_code::Utils::EndsWith(&peVar6->cmd,(string *)local_110);
            std::__cxx11::string::~string(local_110);
            std::allocator<char>::~allocator((allocator<char> *)&local_111);
            if (bVar4) {
              peVar6 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              peVar7 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              std::__cxx11::string::find((char *)&peVar7->cmd,0x1caee3);
              std::__cxx11::string::substr((ulong)&p_1,(ulong)&peVar6->cmd);
              __nptr = (char *)std::__cxx11::string::c_str();
              local_148 = strtoull(__nptr,(char **)&ts,10);
              if (*(char *)ts == '\0') {
                if ((local_41 & 1) != 0) {
                  r_code::Atom::IPointer((ushort)local_14c);
                  pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(this->current_object + 8),
                                      (ulong)extent_index_local._6_2_);
                  r_code::Atom::operator=(pAVar8,local_14c);
                  r_code::Atom::~Atom(local_14c);
                  r_code::Atom::Timestamp();
                  pIVar2 = this->current_object;
                  uVar1 = *puStack_40;
                  *puStack_40 = uVar1 + 1;
                  pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar8,local_150);
                  r_code::Atom::~Atom(local_150);
                  r_code::Atom::Atom(local_154,local_148._4_4_);
                  pIVar2 = this->current_object;
                  uVar1 = *puStack_40;
                  *puStack_40 = uVar1 + 1;
                  pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar8,local_154);
                  r_code::Atom::~Atom(local_154);
                  r_code::Atom::Atom(local_158,(uint)local_148);
                  pIVar2 = this->current_object;
                  uVar1 = *puStack_40;
                  *puStack_40 = uVar1 + 1;
                  pAVar8 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar8,local_158);
                  r_code::Atom::~Atom(local_158);
                }
                this_local._7_1_ = 1;
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
              std::__cxx11::string::~string((string *)&p_1);
              if (bVar4) goto LAB_0019b142;
            }
            SVar5 = save_state(this);
            local_16c._0_3_ = SVar5._0_3_;
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_180,node);
            bVar4 = expression(this,&local_180,TIMESTAMP,extent_index_local._6_2_,puStack_40,
                               (bool)(local_41 & 1));
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_180);
            if (bVar4) {
              this_local._7_1_ = 1;
            }
            else {
              local_184 = local_16c;
              restore_state(this,local_16c);
              if ((p_local._7_1_ & 1) == 0) {
                this_local._7_1_ = 0;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1a8,
                           " error: expected a timestamp or an expr evaluating to a timestamp",
                           &local_1a9);
                std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1c0,node);
                set_error(this,(string *)local_1a8,&local_1c0);
                std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1c0);
                std::__cxx11::string::~string(local_1a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
                this_local._7_1_ = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_0019b142:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::read_timestamp(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (read_nil_us(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, TIMESTAMP)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, TIMESTAMP)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (Utils::EndsWith(node->cmd, "us")) {
        std::string number = node->cmd.substr(0, node->cmd.find("us"));

        try {
            char *p;
            uint64_t ts = std::strtoull(number.c_str(), &p, 10);

            if (*p == 0) {
                if (write) {
                    current_object->code[write_index] = Atom::IPointer(extent_index);
                    current_object->code[extent_index++] = Atom::Timestamp();
                    current_object->code[extent_index++] = ts >> 32;
                    current_object->code[extent_index++] = (ts & UINT32_MAX);
                }

                return true;
            }
        } catch (const std::invalid_argument &ia) { }
    } else {
    }

    State s = save_state();

    if (expression(node, TIMESTAMP, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a timestamp or an expr evaluating to a timestamp", node);
        return false;
    }

    return false;
}